

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunked_sequence.hpp
# Opt level: O2

reference __thiscall
pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::emplace_back<int>
          (chunked_sequence<int,_2UL,_4UL,_4UL> *this,int *args)

{
  reference pvVar1;
  _List_node_base *p_Var2;
  
  if ((this->chunks_).
      super__List_base<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk,_std::allocator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk>_>
      ._M_impl._M_node._M_size != 0) {
    p_Var2 = (this->chunks_).
             super__List_base<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk,_std::allocator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk>_>
             ._M_impl._M_node.super__List_node_base._M_prev;
    if ((_List_node_base *)0x1 < p_Var2[1]._M_next) {
      std::__cxx11::
      list<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk,_std::allocator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk>_>
      ::emplace_back<>(&this->chunks_);
      p_Var2 = (this->chunks_).
               super__List_base<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk,_std::allocator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk>_>
               ._M_impl._M_node.super__List_node_base._M_prev;
    }
    pvVar1 = chunk::emplace_back<int>((chunk *)(p_Var2 + 1),args);
    this->size_ = this->size_ + 1;
    return pvVar1;
  }
  assert_failed("chunks_.size () > 0U",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/adt/chunked_sequence.hpp"
                ,0x129);
}

Assistant:

auto
    chunked_sequence<T, ElementsPerChunk, ActualSize, ActualAlign>::emplace_back (Args &&... args)
        -> reference {
        PSTORE_ASSERT (chunks_.size () > 0U);
        auto * tail = &chunks_.back ();
        if (PSTORE_UNLIKELY (tail->size () >= ElementsPerChunk)) {
            // Append a new chunk.
            chunks_.emplace_back ();
            tail = &chunks_.back ();
        }
        // Append a new instance to the tail chunk.
        reference result = tail->emplace_back (std::forward<Args> (args)...);
        ++size_;
        return result;
    }